

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint-spbset.c
# Opt level: O3

void Curl_uint_spbset_remove(uint_spbset *bset,uint i)

{
  ulong *puVar1;
  byte bVar2;
  
  if (bset != (uint_spbset *)0x0) {
    do {
      if ((bset->head).offset == (i & 0xffffff00)) {
        bVar2 = (byte)i & 0x3f;
        puVar1 = (ulong *)((long)(bset->head).slots + (ulong)(i >> 3 & 0x18));
        *puVar1 = *puVar1 & (-2L << bVar2 | 0xfffffffffffffffeU >> 0x40 - bVar2);
        return;
      }
    } while (((bset->head).offset <= (i & 0xffffff00)) &&
            (bset = (uint_spbset *)((uint_spbset_chunk *)&(bset->head).next)->next,
            (uint_spbset_chunk *)bset != (uint_spbset_chunk *)0x0));
  }
  return;
}

Assistant:

static struct uint_spbset_chunk *
uint_spbset_get_chunk(struct uint_spbset *bset, unsigned int i, bool grow)
{
  struct uint_spbset_chunk *chunk, **panchor = NULL;
  unsigned int i_offset = (i & ~CURL_UINT_SPBSET_CH_MASK);

  if(!bset)
    return NULL;

  for(chunk = &bset->head; chunk;
      panchor = &chunk->next, chunk = chunk->next) {
    if(chunk->offset == i_offset) {
      return chunk;
    }
    else if(chunk->offset > i_offset) {
      /* need new chunk here */
      chunk = NULL;
      break;
    }
  }

  if(!grow)
    return NULL;

  /* need a new one */
  chunk = calloc(1, sizeof(*chunk));
  if(!chunk)
    return NULL;

  if(panchor) {  /* insert between panchor and *panchor */
    chunk->next = *panchor;
    *panchor = chunk;
  }
  else {  /* prepend to head, switching places */
    memcpy(chunk, &bset->head, sizeof(*chunk));
    memset(&bset->head, 0, sizeof(bset->head));
    bset->head.next = chunk;
  }
  chunk->offset = i_offset;
  return chunk;
}